

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::ImageSet::~ImageSet(ImageSet *this)

{
  ~ImageSet(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~ImageSet		(void) {}